

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcComplexProperty::~IfcComplexProperty(IfcComplexProperty *this)

{
  pointer pcVar1;
  undefined1 *puVar2;
  pointer pLVar3;
  
  *(undefined8 *)&this[-1].super_IfcProperty.field_0x60 = 0x8be6e8;
  *(undefined8 *)((long)&(this->super_IfcProperty).Description.ptr.field_2 + 8) = 0x8be738;
  (this->super_IfcProperty).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProperty,_2UL>.
  _vptr_ObjectHelper = (_func_int **)0x8be710;
  pcVar1 = (this->super_IfcProperty).Description.ptr._M_dataplus._M_p;
  if (pcVar1 != (pointer)0x0) {
    operator_delete(pcVar1);
  }
  puVar2 = *(undefined1 **)
            &(this->super_IfcProperty).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProperty,_2UL>
             .field_0x10;
  if (puVar2 != &(this->super_IfcProperty).
                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProperty,_2UL>.field_0x20) {
    operator_delete(puVar2);
  }
  *(undefined8 *)&this[-1].super_IfcProperty.field_0x60 = 0x8be760;
  *(undefined8 *)((long)&(this->super_IfcProperty).Description.ptr.field_2 + 8) = 0x8be788;
  pLVar3 = this[-1].HasProperties.
           super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>_>_>
           .
           super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pLVar3 != (pointer)&this[-1].field_0xa0) {
    operator_delete(pLVar3);
  }
  if (*(undefined1 **)&this[-1].field_0x70 != &this[-1].field_0x80) {
    operator_delete(*(undefined1 **)&this[-1].field_0x70);
  }
  operator_delete(&this[-1].super_IfcProperty.field_0x60);
  return;
}

Assistant:

IfcComplexProperty() : Object("IfcComplexProperty") {}